

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BiDirectionalLSTMLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_bidirectionallstm
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  BiDirectionalLSTMLayerParams *pBVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_bidirectionallstm(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_bidirectionallstm(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pBVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::BiDirectionalLSTMLayerParams>(arena);
    (this->layer_).bidirectionallstm_ = pBVar2;
  }
  return (BiDirectionalLSTMLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BiDirectionalLSTMLayerParams* NeuralNetworkLayer::_internal_mutable_bidirectionallstm() {
  if (!_internal_has_bidirectionallstm()) {
    clear_layer();
    set_has_bidirectionallstm();
    layer_.bidirectionallstm_ = CreateMaybeMessage< ::CoreML::Specification::BiDirectionalLSTMLayerParams >(GetArenaForAllocation());
  }
  return layer_.bidirectionallstm_;
}